

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double *pdVar5;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *pFVar6;
  ulong uVar7;
  value_type vVar8;
  double dVar9;
  double dVar10;
  
  pFVar6 = (fadexpr->fadexpr_).left_;
  uVar4 = (((pFVar6->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar2 < (int)uVar4) {
    uVar2 = uVar4;
  }
  uVar3 = (this->dx_).num_elts;
  if (uVar2 == uVar3) {
    if (uVar2 == 0) goto LAB_01422549;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_01422549;
    }
    if (uVar3 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar6 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar2;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      uVar7 = (ulong)uVar2 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar7);
    (this->dx_).ptr_to_data = pdVar5;
    uVar4 = (((pFVar6->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  }
  if ((uVar4 == 0) || ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0)) {
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        vVar8 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar7);
        pdVar5[uVar7] = vVar8;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
  }
  else if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      vVar8 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
              ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar7);
      pdVar5[uVar7] = vVar8;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
LAB_01422549:
  pFVar6 = (fadexpr->fadexpr_).left_;
  dVar1 = (pFVar6->fadexpr_).left_.constant_;
  dVar9 = cos((((pFVar6->fadexpr_).right_)->fadexpr_).expr_.val_);
  dVar10 = cos((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar10 * dVar9 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}